

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

void __thiscall cmCMakePresetsGraph::PrintAllPresets(cmCMakePresetsGraph *this)

{
  PrintPrecedingNewline local_14;
  cmCMakePresetsGraph *pcStack_10;
  PrintPrecedingNewline newline;
  cmCMakePresetsGraph *this_local;
  
  local_14 = False;
  pcStack_10 = this;
  PrintConfigurePresetList(this,&local_14);
  PrintBuildPresetList(this,&local_14);
  PrintTestPresetList(this,&local_14);
  PrintPackagePresetList(this,&local_14);
  PrintWorkflowPresetList(this,&local_14);
  return;
}

Assistant:

void cmCMakePresetsGraph::PrintAllPresets() const
{
  PrintPrecedingNewline newline = PrintPrecedingNewline::False;
  this->PrintConfigurePresetList(&newline);
  this->PrintBuildPresetList(&newline);
  this->PrintTestPresetList(&newline);
  this->PrintPackagePresetList(&newline);
  this->PrintWorkflowPresetList(&newline);
}